

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_ugrid(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL pRVar3;
  int iVar4;
  uint uVar5;
  REF_STATUS RVar6;
  FILE *__stream;
  REF_CELL *ppRVar7;
  long lVar8;
  REF_INT RVar9;
  REF_INT cell;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  REF_INT *o2n;
  long local_c0;
  REF_INT *n2o;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x5b5,
           "ref_export_ugrid","unable to open file");
    uVar5 = 2;
  }
  else {
    fprintf(__stream,"%d %d %d %d %d %d %d\n",(ulong)(uint)ref_node->n,
            (ulong)(uint)ref_grid->cell[3]->n,(ulong)(uint)ref_grid->cell[6]->n,
            (ulong)(uint)ref_grid->cell[8]->n,(ulong)(uint)ref_grid->cell[9]->n,
            (ulong)(uint)ref_grid->cell[10]->n,(ulong)(uint)ref_grid->cell[0xb]->n);
    uVar5 = ref_node_compact(ref_node,&o2n,&n2o);
    if (uVar5 == 0) {
      if (0 < ref_node->n) {
        lVar10 = 0;
        do {
          pRVar2 = ref_node->real;
          lVar8 = (long)n2o[lVar10];
          fprintf(__stream," %.16e %.16e %.16e\n",pRVar2[lVar8 * 0xf],pRVar2[lVar8 * 0xf + 1],
                  pRVar2[lVar8 * 0xf + 2]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < ref_node->n);
      }
      ref_export_faceid_range(ref_grid,&min_faceid,&max_faceid);
      if (min_faceid <= max_faceid) {
        pRVar3 = ref_grid->cell[3];
        uVar5 = pRVar3->node_per;
        lVar10 = (long)(int)uVar5;
        local_c0 = lVar10;
        iVar1 = min_faceid;
        do {
          if (0 < pRVar3->max) {
            RVar9 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar3,RVar9,nodes);
              if ((RVar6 == 0) && (nodes[lVar10] == iVar1)) {
                if (0 < (int)lVar10) {
                  uVar11 = 0;
                  do {
                    fprintf(__stream," %d",(ulong)(o2n[nodes[uVar11]] + 1));
                    uVar11 = uVar11 + 1;
                  } while (uVar5 != uVar11);
                }
                fputc(10,__stream);
                lVar10 = local_c0;
              }
              RVar9 = RVar9 + 1;
            } while (RVar9 < pRVar3->max);
          }
          bVar12 = iVar1 != max_faceid;
          iVar1 = iVar1 + 1;
        } while (bVar12);
      }
      if (min_faceid <= max_faceid) {
        pRVar3 = ref_grid->cell[6];
        uVar5 = pRVar3->node_per;
        lVar10 = (long)(int)uVar5;
        local_c0 = lVar10;
        iVar1 = min_faceid;
        do {
          if (0 < pRVar3->max) {
            RVar9 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar3,RVar9,nodes);
              if ((RVar6 == 0) && (nodes[lVar10] == iVar1)) {
                if (0 < (int)lVar10) {
                  uVar11 = 0;
                  do {
                    fprintf(__stream," %d",(ulong)(o2n[nodes[uVar11]] + 1));
                    uVar11 = uVar11 + 1;
                  } while (uVar5 != uVar11);
                }
                fputc(10,__stream);
                lVar10 = local_c0;
              }
              RVar9 = RVar9 + 1;
            } while (RVar9 < pRVar3->max);
          }
          bVar12 = iVar1 != max_faceid;
          iVar1 = iVar1 + 1;
        } while (bVar12);
      }
      if (min_faceid <= max_faceid) {
        pRVar3 = ref_grid->cell[3];
        iVar1 = pRVar3->node_per;
        RVar9 = min_faceid;
        do {
          if (0 < pRVar3->max) {
            cell = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar3,cell,nodes);
              if ((RVar6 == 0) && (nodes[iVar1] == RVar9)) {
                fprintf(__stream," %d",(ulong)(uint)nodes[3]);
                fputc(10,__stream);
              }
              cell = cell + 1;
            } while (cell < pRVar3->max);
          }
          bVar12 = RVar9 != max_faceid;
          RVar9 = RVar9 + 1;
        } while (bVar12);
      }
      if (min_faceid <= max_faceid) {
        pRVar3 = ref_grid->cell[6];
        iVar1 = pRVar3->node_per;
        iVar4 = min_faceid;
        do {
          if (0 < pRVar3->max) {
            RVar9 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar3,RVar9,nodes);
              if ((RVar6 == 0) && (nodes[iVar1] == iVar4)) {
                fprintf(__stream," %d",(ulong)(uint)nodes[4]);
                fputc(10,__stream);
              }
              RVar9 = RVar9 + 1;
            } while (RVar9 < pRVar3->max);
          }
          bVar12 = iVar4 != max_faceid;
          iVar4 = iVar4 + 1;
        } while (bVar12);
      }
      ppRVar7 = ref_grid->cell + 8;
      lVar10 = 8;
      do {
        pRVar3 = *ppRVar7;
        if (0 < pRVar3->max) {
          uVar5 = pRVar3->node_per;
          RVar9 = 0;
          do {
            RVar6 = ref_cell_nodes(pRVar3,RVar9,nodes);
            if (RVar6 == 0) {
              if (0 < (int)uVar5) {
                uVar11 = 0;
                do {
                  fprintf(__stream," %d",(ulong)(o2n[nodes[uVar11]] + 1));
                  uVar11 = uVar11 + 1;
                } while (uVar5 != uVar11);
              }
              fputc(10,__stream);
            }
            RVar9 = RVar9 + 1;
          } while (RVar9 < pRVar3->max);
        }
        ppRVar7 = ref_grid->cell + lVar10 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x10);
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      if (o2n != (REF_INT *)0x0) {
        free(o2n);
      }
      fclose(__stream);
      uVar5 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x5c4,"ref_export_ugrid",(ulong)uVar5,"compact");
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_export_ugrid(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT group;
  REF_INT faceid, min_faceid, max_faceid;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  nnode = ref_node_n(ref_node);

  ntri = ref_cell_n(ref_grid_tri(ref_grid));
  nqua = ref_cell_n(ref_grid_qua(ref_grid));

  ntet = ref_cell_n(ref_grid_tet(ref_grid));
  npyr = ref_cell_n(ref_grid_pyr(ref_grid));
  npri = ref_cell_n(ref_grid_pri(ref_grid));
  nhex = ref_cell_n(ref_grid_hex(ref_grid));

  fprintf(file, "%d %d %d %d %d %d %d\n", nnode, ntri, nqua, ntet, npyr, npri,
          nhex);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++)
    fprintf(file, " %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));

  RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++)
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++)
          fprintf(file, " %d", o2n[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++)
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++)
          fprintf(file, " %d", o2n[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        fprintf(file, " %d", nodes[3]);
        fprintf(file, "\n");
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        fprintf(file, " %d", nodes[4]);
        fprintf(file, "\n");
      }
    }
  }

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < node_per; node++)
        fprintf(file, " %d", o2n[nodes[node]] + 1);
      fprintf(file, "\n");
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}